

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall Server::BuryTheDead(Server *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  time_t tVar5;
  _List_node_base *p_Var6;
  
  p_Var2 = (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    if (p_Var2 == (_List_node_base *)&this->clients) {
      return;
    }
    p_Var3 = p_Var2[1]._M_next;
    p_Var6 = p_Var2;
    if ((*(char *)((long)(p_Var3 + 1) + 8) == '\0') &&
       (((p_Var3[7]._M_next == (_List_node_base *)0x0 &&
         (*(_List_node_base **)((long)(p_Var3 + 3) + 8) == (_List_node_base *)0x0)) ||
        (lVar4 = (long)p_Var3[2]._M_next, tVar5 = time((time_t *)0x0), lVar4 + 2 < tVar5)))) {
      close(*(int *)&p_Var3->_M_prev->_M_next);
      (**(code **)((long)p_Var3->_M_next + 0x10))(p_Var3);
      p_Var6 = p_Var2->_M_next;
      psVar1 = &(this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var2,0x18);
      if (p_Var6 == (_List_node_base *)&this->clients) {
        return;
      }
    }
    p_Var2 = p_Var6->_M_next;
  } while( true );
}

Assistant:

void Server::BuryTheDead()
{
	UTIL_IFOREACH(this->clients, it)
	{
		Client *client = *it;

		if (!client->Connected() && ((client->send_buffer.length() == 0 && client->recv_buffer.length() == 0) || client->closed_time + 2 < std::time(0)))
		{
#ifdef WIN32
			closesocket(client->impl->sock);
#else // WIN32
			close(client->impl->sock);
#endif // WIN32
			delete client;
			it = this->clients.erase(it);
			if (it == this->clients.end())
				break;
		}
	}
}